

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O1

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  ulong uVar1;
  mbedtls_ct_uint_t mVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  mbedtls_ct_uint_t mVar9;
  mbedtls_ct_uint_t mVar10;
  size_t total;
  uchar buf [1024];
  uint local_448;
  byte local_438 [11];
  undefined1 local_42d [1021];
  
  uVar1 = ctx->len;
  iVar3 = -0x4080;
  if (0xfffffffffffffc0e < uVar1 - 0x401 && ctx->padding == 0) {
    iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,local_438);
    mVar2 = mbedtls_ct_zero;
    if (iVar3 == 0) {
      uVar7 = uVar1 - 0xb;
      total = output_max_len;
      if (uVar7 < output_max_len) {
        total = uVar7;
      }
      uVar4 = local_438[1] ^ mbedtls_ct_zero ^ 2;
      if (uVar1 < 3) {
        uVar5 = 0;
        mVar9 = mbedtls_ct_zero;
      }
      else {
        uVar8 = 2;
        uVar5 = 0;
        mVar10 = mbedtls_ct_zero;
        do {
          mVar9 = 0xffffffffffffffff;
          if ((long)(-((local_438[uVar8] ^ mbedtls_ct_zero) >> 1) |
                    -(local_438[uVar8] ^ mbedtls_ct_zero)) < 0) {
            mVar9 = mVar10;
          }
          uVar5 = uVar5 + (~(uint)mVar9 & 1);
          uVar8 = uVar8 + 1;
          mVar10 = mVar9;
        } while (uVar1 != uVar8);
      }
      uVar8 = (long)(-(mbedtls_ct_zero >> 1) | -(uVar5 >> 0x3f ^ mbedtls_ct_zero)) >> 0x3f;
      uVar8 = (long)(-(mbedtls_ct_zero >> 1) |
                    -((uVar8 & mbedtls_ct_zero |
                      ~(mbedtls_ct_zero ^ uVar8) & (mbedtls_ct_zero ^ uVar5) - (mbedtls_ct_zero ^ 8)
                      ) >> 0x3f ^ mbedtls_ct_zero)) >> 0x3f |
              (long)(-(uVar4 >> 1) |
                    -uVar4 | -((local_438[0] ^ mbedtls_ct_zero) >> 1) |
                             -(local_438[0] ^ mbedtls_ct_zero)) >> 0x3f | ~mVar9;
      uVar5 = uVar8 & total | ~(mbedtls_ct_zero ^ uVar8) & (uVar1 - uVar5) + 0xfffffffd;
      uVar4 = (long)(-(mbedtls_ct_zero >> 1) | -(total >> 0x3f ^ mbedtls_ct_zero)) >> 0x3f;
      uVar4 = -(mbedtls_ct_zero >> 1) |
              -((uVar4 & mbedtls_ct_zero |
                ~(mbedtls_ct_zero ^ uVar4) &
                (mbedtls_ct_zero ^ total) - (uVar5 & 0xffffffff ^ mbedtls_ct_zero)) >> 0x3f ^
               mbedtls_ct_zero);
      mbedtls_ct_zeroize_if((long)uVar4 >> 0x3f | uVar8,local_42d,uVar7);
      uVar6 = (uint)((long)uVar4 >> 0x3f);
      local_448 = (uint)uVar5;
      uVar7 = (ulong)(~((uint)mbedtls_ct_zero ^ uVar6) & local_448 | (uint)total & uVar6);
      mbedtls_ct_memmove_left(local_438 + (uVar1 - total),total,total - uVar7);
      if (output_max_len != 0) {
        switchD_00b1422a::default(output,local_438 + (uVar1 - total),total);
      }
      iVar3 = -((uint)uVar8 & 0x4100 | uVar6 & ~((uint)mVar2 ^ (uint)uVar8) & 0x4400);
      *olen = uVar7;
    }
    mbedtls_platform_zeroize(local_438,0x400);
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt(mbedtls_rsa_context *ctx,
                                        int (*f_rng)(void *, unsigned char *, size_t),
                                        void *p_rng,
                                        size_t *olen,
                                        const unsigned char *input,
                                        unsigned char *output,
                                        size_t output_max_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t ilen;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    ilen = ctx->len;

    if (ctx->padding != MBEDTLS_RSA_PKCS_V15) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (ilen < 16 || ilen > sizeof(buf)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    ret = mbedtls_rsa_private(ctx, f_rng, p_rng, input, buf);

    if (ret != 0) {
        goto cleanup;
    }

    ret = mbedtls_ct_rsaes_pkcs1_v15_unpadding(buf, ilen,
                                               output, output_max_len, olen);

cleanup:
    mbedtls_platform_zeroize(buf, sizeof(buf));

    return ret;
}